

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O2

void __thiscall
iu_MatcherFailure_x_iutest_x_Ge_Test::Body(iu_MatcherFailure_x_iutest_x_Ge_Test *this)

{
  TestFlag *pTVar1;
  AssertionResult *in_R8;
  ScopedSPITestFlag guard;
  int local_294;
  string local_290;
  SPIFailureChecker iutest_failure_checker;
  AssertionResult iutest_spi_ar;
  string local_210;
  iuCodeMessage local_1f0;
  AssertionResult iutest_ar;
  undefined1 local_198 [392];
  
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  local_198._8_8_ = &local_1f0;
  local_1f0.m_message._M_dataplus._M_p._0_4_ = 1;
  local_198._0_8_ = &PTR__IMatcher_00224880;
  local_290._M_dataplus._M_p._0_4_ = 0;
  iutest::detail::GeMatcher<int>::operator()
            (&iutest_ar,(GeMatcher<int> *)local_198,(int *)&local_290);
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    local_294 = 0;
    iutest::PrintToString<int>(&local_210,&local_294);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_290,(detail *)local_210._M_dataplus._M_p,"Ge(1)",(char *)&iutest_ar,in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x1c6,(char *)CONCAT44(local_290._M_dataplus._M_p._4_4_,
                                       local_290._M_dataplus._M_p._0_4_));
    local_1f0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f0,(Fixed *)local_198);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_210);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  pTVar1 = iutest::TestFlag::GetInstance();
  pTVar1->m_test_flags = (int)guard.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_198,"Ge: 1",(allocator<char> *)&local_1f0);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)local_198);
  std::__cxx11::string::~string((string *)local_198);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x1c6,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)local_198);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  return;
}

Assistant:

IUTEST(MatcherFailure, Ge)
{
    CHECK_FAILURE( IUTEST_ASSERT_THAT(0, Ge(1)), "Ge: 1" );
}